

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

void __thiscall Engine::dispose(Engine *this)

{
  ScriptBlock *this_00;
  Variable *this_01;
  string *psVar1;
  string *psVar2;
  uint local_14;
  uint i;
  Engine *this_local;
  
  this_00 = this->currentScript;
  if (this_00 != (ScriptBlock *)0x0) {
    ScriptBlock::~ScriptBlock(this_00);
    operator_delete(this_00);
  }
  for (local_14 = 0; local_14 < this->variablesCount; local_14 = local_14 + 1) {
    this_01 = this->variables[local_14];
    if (this_01 != (Variable *)0x0) {
      Variable::~Variable(this_01);
      operator_delete(this_01);
    }
  }
  if (this->variables != (Variable **)0x0) {
    operator_delete__(this->variables);
  }
  psVar1 = this->variableNames;
  if (psVar1 != (string *)0x0) {
    psVar2 = psVar1 + *(long *)(psVar1 + -8) * 0x20;
    while (psVar1 != psVar2) {
      psVar2 = psVar2 + -0x20;
      std::__cxx11::string::~string((string *)psVar2);
    }
    operator_delete__(psVar1 + -8);
  }
  for (local_14 = 0; local_14 < this->globalFunctionsCount; local_14 = local_14 + 1) {
    if (this->globalFunctions[local_14] != (IGlobalFunction *)0x0) {
      operator_delete(this->globalFunctions[local_14]);
    }
  }
  if (this->globalFunctions != (IGlobalFunction **)0x0) {
    operator_delete__(this->globalFunctions);
  }
  psVar1 = this->globalFunctionNames;
  if (psVar1 != (string *)0x0) {
    psVar2 = psVar1 + *(long *)(psVar1 + -8) * 0x20;
    while (psVar1 != psVar2) {
      psVar2 = psVar2 + -0x20;
      std::__cxx11::string::~string((string *)psVar2);
    }
    operator_delete__(psVar1 + -8);
  }
  if (this->localFunctions != (LocalFunction **)0x0) {
    operator_delete__(this->localFunctions);
  }
  psVar1 = this->localFunctionNames;
  if (psVar1 != (string *)0x0) {
    psVar2 = psVar1 + *(long *)(psVar1 + -8) * 0x20;
    while (psVar1 != psVar2) {
      psVar2 = psVar2 + -0x20;
      std::__cxx11::string::~string((string *)psVar2);
    }
    operator_delete__(psVar1 + -8);
  }
  return;
}

Assistant:

void Engine::dispose() {
	//Script also deletes local functions
	delete this->currentScript;
	
	unsigned int i;
	for (i = 0; i < this->variablesCount; i++) {
		delete this->variables[i];
		//delete this->variableNames[i];
	}
	delete[] this->variables;
	delete[] this->variableNames;
	
	for (i = 0; i < this->globalFunctionsCount; i++) {
		delete this->globalFunctions[i];
		//delete this->globalFunctionNames[i];
	}
	delete[] this->globalFunctions;
	delete[] this->globalFunctionNames;
	
	/*for (i = 0; i < this->localFunctionsCount; i++) {
		delete this->localFunctionNames[i];
	}*/
	delete[] this->localFunctions;
	delete[] this->localFunctionNames;
}